

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image.cpp
# Opt level: O2

void compute_integral_img(float *gray_image,integral_image *iimage)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  long lVar9;
  int i;
  float fVar10;
  
  uVar1 = iimage->width;
  pfVar4 = iimage->data;
  iVar2 = iimage->data_width;
  iVar3 = iimage->height;
  fVar10 = 0.0;
  uVar6 = (ulong)(~((int)uVar1 >> 0x1f) & uVar1);
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    fVar10 = fVar10 + gray_image[uVar7];
    pfVar4[uVar7] = fVar10;
  }
  pfVar5 = gray_image + (int)uVar1;
  pfVar8 = pfVar4;
  for (lVar9 = 1; pfVar8 = pfVar8 + iVar2, lVar9 < iVar3; lVar9 = lVar9 + 1) {
    fVar10 = 0.0;
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      fVar10 = fVar10 + pfVar5[uVar7];
      pfVar8[uVar7] = fVar10 + pfVar4[uVar7];
    }
    pfVar4 = pfVar4 + iVar2;
    pfVar5 = pfVar5 + (int)uVar1;
  }
  return;
}

Assistant:

void compute_integral_img(float *gray_image, struct integral_image *iimage) {
    
    float *iimage_data = iimage->data;
    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    float row_sum = 0.0f;

    /* sum up the first row */
    for (int i = 0; i < width; ++i) {
        /* previous rows are 0 */
        row_sum += gray_image[i];
        iimage_data[i] = row_sum;
    }

    /* sum all remaining rows*/
    for (int j = 1; j < height; ++j) {
        row_sum = 0.0f;
        for (int i = 0; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            /*add sum of current row until current idx to sum of all previous rows until current index */
            iimage_data[j * data_width + i] = row_sum + iimage_data[(j - 1) * data_width + i];
        }
    }
}